

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O3

void __thiscall
slang::parsing::Preprocessor::applyDiagnosticPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> this_00;
  SyntaxNode *this_01;
  int iVar1;
  ulong uVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  SourceLocation SVar4;
  Diagnostic *this_02;
  char *pcVar5;
  size_t sVar7;
  byte *pbVar8;
  ulong uVar9;
  long lVar10;
  SyntaxNode *this_03;
  SourceManager *pSVar11;
  ulong uVar12;
  size_type __rlen;
  SyntaxNode *pSVar13;
  string_view sVar14;
  SourceRange SVar15;
  Token last;
  DiagnosticSeverity local_64;
  Token local_40;
  int *piVar6;
  
  sVar7 = (pragma->args).elements._M_extent._M_extent_value;
  if (sVar7 == 0) {
    local_40 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)pragma);
    SVar4 = Token::location(&local_40);
    sVar14 = Token::rawText(&local_40);
    addDiag(this,(DiagCode)0x1d0004,(SourceLocation)((long)SVar4 + sVar14._M_len * 0x10000000));
  }
  else {
    uVar2 = sVar7 + 1;
    if (1 < uVar2) {
      uVar12 = 0;
      do {
        ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((pragma->args).elements._M_ptr + uVar12 * 2));
        this_03 = *ppSVar3;
        if (this_03->kind == NameValuePragmaExpression) {
          sVar14 = Token::valueText((Token *)(this_03 + 1));
          piVar6 = (int *)sVar14._M_str;
          sVar7 = sVar14._M_len;
          if (sVar7 == 4) {
            iVar1 = bcmp(piVar6,"warn",4);
            if (iVar1 != 0) {
LAB_006952b9:
              SVar15 = Token::range((Token *)(this_03 + 1));
              addDiag(this,(DiagCode)0x1e0004,SVar15);
              goto LAB_00695324;
            }
            local_64 = Warning;
          }
          else if (sVar7 == 5) {
            iVar1 = bcmp(piVar6,"error",5);
            if (iVar1 == 0) {
              local_64 = Error;
            }
            else {
              if ((char)piVar6[1] != 'l' || *piVar6 != 0x61746166) goto LAB_006952b9;
              local_64 = Fatal;
            }
          }
          else {
            if ((sVar7 != 6) || ((short)piVar6[1] != 0x6572 || *piVar6 != 0x6f6e6769))
            goto LAB_006952b9;
            local_64 = Ignored;
          }
          this_03 = this_03[2].parent;
          if (this_03->kind == SimplePragmaExpression) {
            pSVar13 = this_03 + 1;
            if ((short)this_03[1].kind != AcceptOnPropertyExpr) {
              SVar15 = Token::range((Token *)pSVar13);
              goto LAB_0069524a;
            }
            pSVar11 = this->sourceManager;
            SVar4 = Token::location((Token *)pSVar13);
            sVar14 = Token::valueText((Token *)pSVar13);
            SourceManager::addDiagnosticDirective(pSVar11,SVar4,sVar14,local_64);
          }
          else {
            if (this_03->kind != ParenPragmaExpression) goto LAB_00695245;
            pbVar8 = (byte *)((long)&(this_03[3].previewNode)->kind + 1);
            if ((byte *)0x1 < pbVar8) {
              uVar9 = (ulong)pbVar8 >> 1;
              lVar10 = 0;
              do {
                ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                    ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                      *)((long)&(this_03[3].parent)->kind + lVar10));
                pSVar13 = *ppSVar3;
                if (pSVar13->kind == SimplePragmaExpression) {
                  this_01 = pSVar13 + 1;
                  if ((short)pSVar13[1].kind == AcceptOnPropertyExpr) {
                    pSVar11 = this->sourceManager;
                    SVar4 = Token::location((Token *)this_01);
                    sVar14 = Token::valueText((Token *)this_01);
                    SourceManager::addDiagnosticDirective(pSVar11,SVar4,sVar14,local_64);
                  }
                  else {
                    SVar15 = Token::range((Token *)this_01);
                    addDiag(this,(DiagCode)0x1d0004,SVar15);
                  }
                }
                else {
                  SVar15 = slang::syntax::SyntaxNode::sourceRange(pSVar13);
                  addDiag(this,(DiagCode)0x1d0004,SVar15);
                }
                lVar10 = lVar10 + 0x30;
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
            }
          }
        }
        else if (this_03->kind == SimplePragmaExpression) {
          this_00 = this_03 + 1;
          sVar14 = Token::rawText((Token *)this_00);
          piVar6 = (int *)sVar14._M_str;
          if ((short)this_03[1].kind == TokenList) {
            if (sVar14._M_len == 3) {
              if (*(char *)((long)piVar6 + 2) != 'p' || (short)*piVar6 != 0x6f70) goto LAB_006952f1;
              pSVar11 = this->sourceManager;
              SVar4 = Token::location((Token *)this_00);
              sVar7 = 7;
              pcVar5 = "__pop__";
            }
            else {
              if ((sVar14._M_len != 4) || (*piVar6 != 0x68737570)) goto LAB_006952f1;
              pSVar11 = this->sourceManager;
              SVar4 = Token::location((Token *)this_00);
              sVar7 = 8;
              pcVar5 = "__push__";
            }
            sVar14._M_str = pcVar5;
            sVar14._M_len = sVar7;
            SourceManager::addDiagnosticDirective(pSVar11,SVar4,sVar14,Ignored);
          }
          else {
LAB_006952f1:
            SVar15 = Token::range((Token *)this_00);
            this_02 = addDiag(this,(DiagCode)0x2a0004,SVar15);
            Diagnostic::operator<<(this_02,sVar14);
          }
        }
        else {
LAB_00695245:
          SVar15 = slang::syntax::SyntaxNode::sourceRange(this_03);
LAB_0069524a:
          addDiag(this,(DiagCode)0x1d0004,SVar15);
        }
LAB_00695324:
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar2 >> 1);
    }
  }
  return;
}

Assistant:

void Preprocessor::applyDiagnosticPragma(const PragmaDirectiveSyntax& pragma) {
    if (pragma.args.empty()) {
        Token last = pragma.getLastToken();
        addDiag(diag::ExpectedDiagPragmaArg, last.location() + last.rawText().length());
        return;
    }

    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            std::string_view action = simple.value.rawText();
            if (simple.value.kind == TokenKind::Identifier && action == "push") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__push__",
                                                     DiagnosticSeverity::Ignored);
            }
            else if (simple.value.kind == TokenKind::Identifier && action == "pop") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__pop__",
                                                     DiagnosticSeverity::Ignored);
            }
            else {
                addDiag(diag::UnknownDiagPragmaArg, simple.value.range()) << action;
            }
        }
        else if (arg->kind == SyntaxKind::NameValuePragmaExpression) {
            auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();

            DiagnosticSeverity severity;
            std::string_view text = nvp.name.valueText();
            if (text == "ignore")
                severity = DiagnosticSeverity::Ignored;
            else if (text == "warn")
                severity = DiagnosticSeverity::Warning;
            else if (text == "error")
                severity = DiagnosticSeverity::Error;
            else if (text == "fatal")
                severity = DiagnosticSeverity::Fatal;
            else {
                addDiag(diag::ExpectedDiagPragmaLevel, nvp.name.range());
                continue;
            }

            auto setDirective = [&](const PragmaExpressionSyntax& expr) {
                if (expr.kind == SyntaxKind::SimplePragmaExpression) {
                    auto& simple = expr.as<SimplePragmaExpressionSyntax>();
                    if (simple.value.kind == TokenKind::StringLiteral) {
                        sourceManager.addDiagnosticDirective(simple.value.location(),
                                                             simple.value.valueText(), severity);
                    }
                    else {
                        addDiag(diag::ExpectedDiagPragmaArg, simple.value.range());
                    }
                }
                else {
                    addDiag(diag::ExpectedDiagPragmaArg, expr.sourceRange());
                }
            };

            if (nvp.value->kind == SyntaxKind::ParenPragmaExpression) {
                auto& paren = nvp.value->as<ParenPragmaExpressionSyntax>();
                for (auto value : paren.values)
                    setDirective(*value);
            }
            else {
                setDirective(*nvp.value);
            }
        }
        else {
            addDiag(diag::ExpectedDiagPragmaArg, arg->sourceRange());
        }
    }
}